

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_string.cpp
# Opt level: O1

void __thiscall
JsonString_Utf16HighWithNoLowSurrogate_Test::~JsonString_Utf16HighWithNoLowSurrogate_Test
          (JsonString_Utf16HighWithNoLowSurrogate_Test *this)

{
  void *in_RAX;
  
  (this->super_JsonString).super_Test._vptr_Test = (_func_int **)&PTR__JsonString_001c25a8;
  mock_json_callbacks::~mock_json_callbacks
            (&(this->super_JsonString).callbacks_.super_mock_json_callbacks);
  testing::Mock::UnregisterCallReaction(in_RAX);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x338);
  return;
}

Assistant:

TEST_F (JsonString, Utf16HighWithNoLowSurrogate) {
    // UTF-16 high surrogate followed by non-surrogate UTF-16 hex code point.
    auto p = json::make_parser (proxy_);
    p.input (R"("\uD834\u30A1")").eof ();
    EXPECT_EQ (p.last_error (), make_error_code (json::error_code::bad_unicode_code_point));
    EXPECT_EQ (p.coordinate (), (json::coord{13U, 1U}));
}